

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Config::getTestListFile_abi_cxx11_(string *__return_storage_ptr__,Config *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->m_data).testListFile);
  return __return_storage_ptr__;
}

Assistant:

std::string Config::getTestListFile() const { return m_data.testListFile; }